

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::BinaryToHex(string *__return_storage_ptr__,string *binary)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)binary->_M_string_length * '\x02');
  if (binary->_M_string_length != 0) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar2 = 0;
    do {
      pcVar1[uVar2 * 2] = (&DAT_0039eba0)[(byte)(binary->_M_dataplus)._M_p[uVar2] >> 4];
      pcVar1[uVar2 * 2 + 1] = (&DAT_0039eba0)[(byte)(binary->_M_dataplus)._M_p[uVar2] & 0xf];
      uVar2 = uVar2 + 1;
    } while (uVar2 < binary->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryToHex(const string& binary) {
  string dest;
  size_t i;
  unsigned char symbol[16] = {
    '0', '1', '2', '3',
    '4', '5', '6', '7',
    '8', '9', 'a', 'b',
    'c', 'd', 'e', 'f',
  };

  dest.resize(binary.size() * 2);
  char* append_ptr = &dest[0];

  for (i = 0; i < binary.size(); i++) {
    *append_ptr++ = symbol[(binary[i] & 0xf0) >> 4];
    *append_ptr++ = symbol[binary[i] & 0x0f];
  }

  return dest;
}